

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

int32_t __thiscall Bitmap::getPixelIndex(Bitmap *this,int32_t pixel,int32_t xoff,int32_t yoff)

{
  uint uVar1;
  int iVar2;
  int32_t index;
  int32_t yoff_local;
  int32_t xoff_local;
  int32_t pixel_local;
  Bitmap *this_local;
  
  if (this->orientation == Horizontally) {
    uVar1 = xoff + pixel;
    if (((-1 < (int)uVar1) && (uVar1 / this->width == (uint)pixel / this->width)) &&
       ((iVar2 = yoff * this->width + uVar1, -1 < iVar2 && (iVar2 < this->length)))) {
      return iVar2;
    }
  }
  else if ((((yoff <= pixel) && ((uint)(pixel - yoff) / this->width == (uint)pixel / this->width))
           && (iVar2 = xoff * this->width + (pixel - yoff), -1 < iVar2)) && (iVar2 < this->length))
  {
    return iVar2;
  }
  return -1;
}

Assistant:

int32_t Bitmap::getPixelIndex(const int32_t pixel, const int32_t xoff, const int32_t yoff)
{
   int32_t index = pixel;
   if (orientation == Orientation::Horizontally)
   {
      index += xoff;
      if (index >= 0)
      {
         if ((index / this->width) == (pixel / this->width)) //stay in the same line (as pixel was)?
         {
            index += yoff * this->width;
            if ((index >= 0) && (index < this->length))
            {
               return index;
            }
         }
      }
   }
   else //Vertically
   {
      if (index >= yoff)
      {
         index -= yoff;
         if ((index / this->width) == (pixel / this->width)) //stay in the same line (as pixel was)?
         {
            index += xoff * this->width;
            if ((index >= 0) && (index < this->length))
            {
               return index;
            }
         }
      }
   }
   //otherwise: "label-overflow"
   return -1;
}